

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O0

void __thiscall
rsg::ExecutionContext::ExecutionContext
          (ExecutionContext *this,Sampler2DMap *samplers2D,SamplerCubeMap *samplersCube)

{
  ExecConstValueAccess value;
  undefined1 local_120 [8];
  ExecMaskStorage initVal;
  SamplerCubeMap *samplersCube_local;
  Sampler2DMap *samplers2D_local;
  ExecutionContext *this_local;
  
  initVal.m_data._248_8_ = samplersCube;
  std::
  map<const_rsg::Variable_*,_rsg::ValueStorage<64>_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
  ::map(&this->m_varValues);
  this->m_samplers2D = samplers2D;
  this->m_samplersCube = (SamplerCubeMap *)initVal.m_data._248_8_;
  std::vector<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>::vector
            (&this->m_execMaskStack);
  ExecMaskStorage::ExecMaskStorage((ExecMaskStorage *)local_120,true);
  value = (ExecConstValueAccess)ExecMaskStorage::getValue((ExecMaskStorage *)local_120);
  pushExecutionMask(this,value);
  return;
}

Assistant:

ExecutionContext::ExecutionContext (const Sampler2DMap& samplers2D, const SamplerCubeMap& samplersCube)
	: m_samplers2D		(samplers2D)
	, m_samplersCube	(samplersCube)
{
	// Initialize execution mask to true
	ExecMaskStorage initVal(true);
	pushExecutionMask(initVal.getValue());
}